

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O1

REF_STATUS
ref_node_tri_projection(REF_NODE ref_node,REF_INT *nodes,REF_DBL *xyz,REF_DBL *projection)

{
  REF_DBL *pRVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  REF_DBL area;
  double local_30;
  
  uVar2 = ref_node_tri_area(ref_node,nodes,&local_30);
  if (uVar2 == 0) {
    pRVar1 = ref_node->real;
    lVar3 = (long)*nodes;
    lVar4 = (long)nodes[1];
    lVar5 = (long)nodes[2];
    dVar7 = *xyz;
    dVar6 = xyz[1];
    dVar8 = xyz[2];
    dVar6 = (((pRVar1[lVar4 * 0xf] - dVar7) * (pRVar1[lVar5 * 0xf + 1] - dVar6) -
             (pRVar1[lVar5 * 0xf] - dVar7) * (pRVar1[lVar4 * 0xf + 1] - dVar6)) *
             (pRVar1[lVar3 * 0xf + 2] - dVar8) +
            (((pRVar1[lVar4 * 0xf + 1] - dVar6) * (pRVar1[lVar5 * 0xf + 2] - dVar8) -
             (pRVar1[lVar4 * 0xf + 2] - dVar8) * (pRVar1[lVar5 * 0xf + 1] - dVar6)) *
             (pRVar1[lVar3 * 0xf] - dVar7) -
            ((pRVar1[lVar5 * 0xf + 2] - dVar8) * (pRVar1[lVar4 * 0xf] - dVar7) -
            (pRVar1[lVar4 * 0xf + 2] - dVar8) * (pRVar1[lVar5 * 0xf] - dVar7)) *
            (pRVar1[lVar3 * 0xf + 1] - dVar6))) / -6.0;
    dVar7 = local_30 * 1e+20;
    if (dVar7 <= -dVar7) {
      dVar7 = -dVar7;
    }
    dVar8 = dVar6;
    if (dVar6 <= -dVar6) {
      dVar8 = -dVar6;
    }
    if (dVar7 <= dVar8) {
      *projection = 0.0;
      printf("%s: %d: %s: div zero vol %.18e area %.18e\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0xc14,
             "ref_node_tri_projection");
      uVar2 = 4;
    }
    else {
      *projection = (dVar6 / local_30) * 3.0;
      uVar2 = 0;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0xc01,
           "ref_node_tri_projection",(ulong)uVar2,"area");
  }
  return uVar2;
}

Assistant:

REF_FCN REF_STATUS ref_node_tri_projection(REF_NODE ref_node, REF_INT *nodes,
                                           REF_DBL *xyz, REF_DBL *projection) {
  REF_DBL area;
  REF_DBL *a, *b, *c, *d;
  REF_DBL m11, m12, m13;
  REF_DBL vol;
  RSS(ref_node_tri_area(ref_node, nodes, &area), "area");

  a = ref_node_xyz_ptr(ref_node, nodes[0]);
  b = ref_node_xyz_ptr(ref_node, nodes[1]);
  c = ref_node_xyz_ptr(ref_node, nodes[2]);
  d = xyz;

  m11 = (a[0] - d[0]) *
        ((b[1] - d[1]) * (c[2] - d[2]) - (c[1] - d[1]) * (b[2] - d[2]));
  m12 = (a[1] - d[1]) *
        ((b[0] - d[0]) * (c[2] - d[2]) - (c[0] - d[0]) * (b[2] - d[2]));
  m13 = (a[2] - d[2]) *
        ((b[0] - d[0]) * (c[1] - d[1]) - (c[0] - d[0]) * (b[1] - d[1]));
  vol = -(m11 - m12 + m13) / 6.0;

  if (ref_math_divisible(vol, area)) {
    *projection = 3.0 * (vol / area);
  } else {
    *projection = 0.0;
    printf("%s: %d: %s: div zero vol %.18e area %.18e\n", __FILE__, __LINE__,
           __func__, vol, area);
    return REF_DIV_ZERO;
  }

  return REF_SUCCESS;
}